

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O1

void __thiscall DL::DataLisp_Internal::~DataLisp_Internal(DataLisp_Internal *this)

{
  SyntaxTree *pSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  
  pSVar1 = this->mTree;
  if (pSVar1 != (SyntaxTree *)0x0) {
    ppSVar2 = (pSVar1->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppSVar3 = (pSVar1->Nodes).
                   super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar2;
        ppSVar3 = ppSVar3 + 1) {
      deleteNode(*ppSVar3);
    }
    pSVar1 = this->mTree;
    if (pSVar1 != (SyntaxTree *)0x0) {
      ppSVar3 = (pSVar1->Nodes).
                super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar3 != (pointer)0x0) {
        operator_delete(ppSVar3,(long)(pSVar1->Nodes).
                                      super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppSVar3);
      }
      operator_delete(pSVar1,0x18);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DL::Data_(*)(const_std::vector<DL::Data,_std::allocator<DL::Data>_>_&,_DL::VM_&)>_>_>
  ::~_Rb_tree(&(this->mExpressions)._M_t);
  return;
}

Assistant:

~DataLisp_Internal()
	{
		if (mTree) {
			for (StatementNode* ptr : mTree->Nodes)
				deleteNode(ptr);

			delete mTree;
		}
	}